

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> __thiscall
wabt::MakeUnique<wabt::TableImport,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  string_view name;
  TableImport *this_00;
  
  this_00 = (TableImport *)operator_new(0x90);
  name.data_ = (args->_M_dataplus)._M_p;
  name.size_ = args->_M_string_length;
  TableImport::TableImport(this_00,name);
  *(TableImport **)this = this_00;
  return (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         (__uniq_ptr_data<wabt::TableImport,_std::default_delete<wabt::TableImport>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}